

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QString * QLocale::territoryToCode(QString *__return_storage_ptr__,Territory territory)

{
  QLatin1StringView latin1;
  
  latin1 = QLocalePrivate::territoryToCode(territory);
  QString::QString(__return_storage_ptr__,latin1);
  return __return_storage_ptr__;
}

Assistant:

QString QLocale::territoryToCode(QLocale::Territory territory)
{
    return QLocalePrivate::territoryToCode(territory);
}